

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O0

int32 Js::JavascriptConversion::ToInt32_Full(Var aValue,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  JavascriptBoolean *pJVar5;
  JavascriptTypedNumber<long> *pJVar6;
  long lVar7;
  JavascriptTypedNumber<unsigned_long> *pJVar8;
  unsigned_long uVar9;
  JavascriptString *pJVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ScriptContext *local_80;
  double local_78;
  double result_1;
  double result;
  ScriptContext *pSStack_60;
  TypeId typeId;
  ScriptContext *objectScriptContext;
  ScriptContext *scriptContext_local;
  Var aValue_local;
  ScriptContext *local_40;
  TypeId local_34;
  ScriptContext *local_30;
  TypeId local_28;
  TypeId local_24;
  RecyclableObject *pRStack_20;
  TypeId typeId_1;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId_2;
  
  objectScriptContext = scriptContext;
  scriptContext_local = (ScriptContext *)aValue;
  bVar2 = JavascriptStackWalker::ValidateTopJitFrame(scriptContext);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x3ca,
                                "(Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext))",
                                "Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(scriptContext_local);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x3cb,"(!TaggedInt::Is(aValue))","Should be detected");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = VarIs<Js::RecyclableObject>(scriptContext_local);
  if (bVar2) {
    this = UnsafeVarTo<Js::RecyclableObject>(scriptContext_local);
    local_80 = RecyclableObject::GetScriptContext(this);
  }
  else {
    local_80 = (ScriptContext *)0x0;
  }
  pSStack_60 = local_80;
  local_30 = scriptContext_local;
  if (scriptContext_local == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(local_30);
  if (bVar2) {
    local_28 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(local_30);
    if (bVar2) {
      local_28 = TypeIds_Number;
    }
    else {
      pRStack_20 = UnsafeVarTo<Js::RecyclableObject>(local_30);
      if (pRStack_20 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_24 = RecyclableObject::GetTypeId(pRStack_20);
      if ((0x57 < (int)local_24) && (BVar3 = RecyclableObject::IsExternal(pRStack_20), BVar3 == 0))
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_28 = local_24;
    }
  }
  result._4_4_ = local_28;
  if (local_28 == TypeIds_Number) {
    dVar11 = JavascriptNumber::GetValue(scriptContext_local);
    aValue_local._4_4_ = JavascriptMath::ToInt32Core(dVar11);
  }
  else {
    switch(local_28) {
    case TypeIds_Boolean:
      pJVar5 = UnsafeVarTo<Js::JavascriptBoolean>(scriptContext_local);
      BVar3 = JavascriptBoolean::GetValue(pJVar5);
      aValue_local._4_4_ = (uint)(BVar3 != 0);
      break;
    case TypeIds_FirstNumberType:
      aValue_local._4_4_ = TaggedInt::ToInt32(scriptContext_local);
      break;
    default:
      BVar3 = Js::JavascriptOperators::IsObject(scriptContext_local);
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                    ,0x3fd,"(JavascriptOperators::IsObject(aValue))",
                                    "bad type object in conversion ToInteger32");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      scriptContext_local =
           (ScriptContext *)
           ToPrimitive<(Js::JavascriptHint)2>(scriptContext_local,objectScriptContext);
      local_40 = scriptContext_local;
      if (scriptContext_local == (ScriptContext *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      bVar2 = TaggedInt::Is(local_40);
      if (bVar2) {
        local_34 = TypeIds_FirstNumberType;
      }
      else {
        bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(local_40);
        if (bVar2) {
          local_34 = TypeIds_Number;
        }
        else {
          pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(local_40);
          if (pRStack_10 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
          local_14 = RecyclableObject::GetTypeId(pRStack_10);
          if ((0x57 < (int)local_14) &&
             (BVar3 = RecyclableObject::IsExternal(pRStack_10), BVar3 == 0)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
          local_34 = local_14;
        }
      }
      switch(local_34) {
      case TypeIds_Boolean:
        pJVar5 = UnsafeVarTo<Js::JavascriptBoolean>(scriptContext_local);
        BVar3 = JavascriptBoolean::GetValue(pJVar5);
        aValue_local._4_4_ = (uint)(BVar3 != 0);
        break;
      case TypeIds_FirstNumberType:
        aValue_local._4_4_ = TaggedInt::ToInt32(scriptContext_local);
        break;
      case TypeIds_Number:
        dVar11 = JavascriptNumber::GetValue(scriptContext_local);
        aValue_local._4_4_ = ToInt32(dVar11);
        break;
      case TypeIds_Int64Number:
        pJVar6 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(scriptContext_local);
        lVar7 = JavascriptTypedNumber<long>::GetValue(pJVar6);
        aValue_local._4_4_ = JavascriptMath::ToInt32Core((double)lVar7);
        break;
      case TypeIds_LastNumberType:
        pJVar8 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(scriptContext_local);
        uVar9 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar8);
        auVar13._8_4_ = (int)(uVar9 >> 0x20);
        auVar13._0_8_ = uVar9;
        auVar13._12_4_ = 0x45300000;
        aValue_local._4_4_ =
             JavascriptMath::ToInt32Core
                       ((auVar13._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
        break;
      case TypeIds_String:
        pJVar10 = UnsafeVarTo<Js::JavascriptString>(scriptContext_local);
        bVar2 = JavascriptString::ToDouble(pJVar10,&local_78);
        if (bVar2) {
          aValue_local._4_4_ = ToInt32(local_78);
        }
        else {
          aValue_local._4_4_ = 0;
        }
        break;
      case TypeIds_Symbol:
        JavascriptError::TryThrowTypeError(pSStack_60,objectScriptContext,-0x7ff5ec77,(PCWSTR)0x0);
      case TypeIds_Undefined:
      case TypeIds_Null:
        aValue_local._4_4_ = 0;
        break;
      default:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                    ,0x429,"(0)",
                                    "wrong call in ToInteger32_Full, no dynamic objects should get here."
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
        JavascriptError::ThrowError(objectScriptContext,-0x7ff5fe4a,(PCWSTR)0x0);
      }
      break;
    case TypeIds_Int64Number:
      pJVar6 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(scriptContext_local);
      lVar7 = JavascriptTypedNumber<long>::GetValue(pJVar6);
      aValue_local._4_4_ = JavascriptMath::ToInt32Core((double)lVar7);
      break;
    case TypeIds_LastNumberType:
      pJVar8 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(scriptContext_local);
      uVar9 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar8);
      auVar12._8_4_ = (int)(uVar9 >> 0x20);
      auVar12._0_8_ = uVar9;
      auVar12._12_4_ = 0x45300000;
      aValue_local._4_4_ =
           JavascriptMath::ToInt32Core
                     ((auVar12._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
      break;
    case TypeIds_String:
      pJVar10 = UnsafeVarTo<Js::JavascriptString>(scriptContext_local);
      bVar2 = JavascriptString::ToDouble(pJVar10,&result_1);
      if (bVar2) {
        aValue_local._4_4_ = JavascriptMath::ToInt32Core(result_1);
      }
      else {
        aValue_local._4_4_ = 0;
      }
      break;
    case TypeIds_Symbol:
      JavascriptError::TryThrowTypeError(pSStack_60,objectScriptContext,-0x7ff5ec77,(PCWSTR)0x0);
    case TypeIds_Undefined:
    case TypeIds_Null:
      aValue_local._4_4_ = 0;
    }
  }
  return aValue_local._4_4_;
}

Assistant:

int32 JavascriptConversion::ToInt32_Full(Var aValue, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Conv_ToInt32_Full);
        Assert(Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext));
        AssertMsg(!TaggedInt::Is(aValue), "Should be detected");

        ScriptContext * objectScriptContext = VarIs<RecyclableObject>(aValue) ? UnsafeVarTo<RecyclableObject>(aValue)->GetScriptContext() : nullptr;
        // This is used when TaggedInt's overflow but remain under int32
        // so Number is our most critical case:

        TypeId typeId = JavascriptOperators::GetTypeId(aValue);

        if (typeId == TypeIds_Number)
        {
            return JavascriptMath::ToInt32Core(JavascriptNumber::GetValue(aValue));
        }

        switch (typeId)
        {
        case TypeIds_Symbol:
            JavascriptError::TryThrowTypeError(objectScriptContext, scriptContext, JSERR_NeedNumber);
            // Fallthrough to return 0 if exceptions are disabled
        case TypeIds_Undefined:
        case TypeIds_Null:
            return  0;

        case TypeIds_Integer:
            return TaggedInt::ToInt32(aValue);

        case TypeIds_Boolean:
            return UnsafeVarTo<JavascriptBoolean>(aValue)->GetValue() ? 1 : +0;

        case TypeIds_Int64Number:
            // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
            // treat it as double anyhow.
            return JavascriptMath::ToInt32Core((double)UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue());

        case TypeIds_UInt64Number:
            // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
            // treat it as double anyhow.
            return JavascriptMath::ToInt32Core((double)UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue());

        case TypeIds_String:
        {
            double result;
            if (UnsafeVarTo<JavascriptString>(aValue)->ToDouble(&result))
            {
                return JavascriptMath::ToInt32Core(result);
            }
            // If the string isn't a valid number, ToDouble returns NaN, and ToInt32 of that is 0
            return 0;
        }

        default:
            AssertMsg(JavascriptOperators::IsObject(aValue), "bad type object in conversion ToInteger32");
            aValue = ToPrimitive<JavascriptHint::HintNumber>(aValue, scriptContext);
        }

        switch (JavascriptOperators::GetTypeId(aValue))
        {
        case TypeIds_Symbol:
            JavascriptError::TryThrowTypeError(objectScriptContext, scriptContext, JSERR_NeedNumber);
            // Fallthrough to return 0 if exceptions are disabled
        case TypeIds_Undefined:
        case TypeIds_Null:
            return  0;

        case TypeIds_Integer:
            return TaggedInt::ToInt32(aValue);

        case TypeIds_Boolean:
            return UnsafeVarTo<JavascriptBoolean>(aValue)->GetValue() ? 1 : +0;

        case TypeIds_Number:
            return ToInt32(JavascriptNumber::GetValue(aValue));

        case TypeIds_Int64Number:
            // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
            // treat it as double anyhow.
            return JavascriptMath::ToInt32Core((double)UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue());

        case TypeIds_UInt64Number:
            // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
            // treat it as double anyhow.
            return JavascriptMath::ToInt32Core((double)UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue());

        case TypeIds_String:
        {
            double result;
            if (UnsafeVarTo<JavascriptString>(aValue)->ToDouble(&result))
            {
                return ToInt32(result);
            }
            // If the string isn't a valid number, ToDouble returns NaN, and ToInt32 of that is 0
            return 0;
        }

        default:
            AssertMsg(FALSE, "wrong call in ToInteger32_Full, no dynamic objects should get here.");
            JavascriptError::ThrowError(scriptContext, VBSERR_OLENoPropOrMethod);
        }
        JIT_HELPER_END(Conv_ToInt32_Full);
    }